

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
llvm::SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
          (SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *this,
          int *Args,SmallVector<unsigned_int,_0U> *Args_1)

{
  int *piVar1;
  uint uVar2;
  
  uVar2 = *(uint *)(this + 8);
  if (*(uint *)(this + 0xc) <= uVar2) {
    SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>::
    grow((SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
          *)this,0);
    uVar2 = *(uint *)(this + 8);
  }
  piVar1 = (int *)(*(long *)this + (ulong)uVar2 * 0x18);
  *piVar1 = *Args;
  SmallVector<unsigned_int,_0U>::SmallVector((SmallVector<unsigned_int,_0U> *)(piVar1 + 2),Args_1);
  uVar2 = *(uint *)(this + 8);
  if (uVar2 < *(uint *)(this + 0xc)) {
    *(uint *)(this + 8) = uVar2 + 1;
    return (reference)((ulong)uVar2 * 0x18 + *(long *)this);
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }